

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O1

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeDOFSensorVariable
          (BerdyHelper *this,BerdySensorTypes sensorType,DOFIndex idx)

{
  long lVar1;
  long lVar2;
  IndexRange IVar3;
  
  lVar1 = iDynTree::IndexRange::InvalidRange();
  if ((this->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
    iDynTree::Traversal::getChildLinkIndexFromJointIndex
              ((Model *)&this->m_dynamicsTraversal,(long)this);
    lVar2 = iDynTree::Traversal::getTraversalIndexFromLinkIndex((long)&this->m_dynamicsTraversal);
    if (sensorType == DOF_ACCELERATION_SENSOR) {
      lVar1 = (this->berdySensorTypeOffsets).dofAccelerationOffset + lVar2 + -1;
    }
    if (sensorType == DOF_TORQUE_SENSOR) {
      lVar1 = lVar2 + -1 + (this->berdySensorTypeOffsets).dofTorquesOffset;
    }
  }
  else {
    if (sensorType == DOF_ACCELERATION_SENSOR) {
      lVar1 = (this->berdySensorTypeOffsets).dofAccelerationOffset + idx;
    }
    if (sensorType == DOF_TORQUE_SENSOR) {
      lVar1 = idx + (this->berdySensorTypeOffsets).dofTorquesOffset;
    }
  }
  IVar3.size = 1;
  IVar3.offset = lVar1;
  return IVar3;
}

Assistant:

IndexRange BerdyHelper::getRangeDOFSensorVariable(const BerdySensorTypes sensorType, const DOFIndex idx) const
{
    IndexRange ret = IndexRange::InvalidRange();
    ret.size = 1;

    if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
    {
        // For ORIGINAL_BERDY_FIXED_BASE we know  that DOFIndex is always equalt to JointIndex
        TraversalIndex trvIdx = getTraversalIndexFromJointIndex(m_model,m_dynamicsTraversal,(JointIndex)idx);

        if( sensorType == DOF_ACCELERATION_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofAccelerationOffset + (trvIdx-1);
        }

        if( sensorType == DOF_TORQUE_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofTorquesOffset + (trvIdx-1);
        }
    }
    else
    {
        assert(m_options.berdyVariant == BERDY_FLOATING_BASE);

        if( sensorType == DOF_ACCELERATION_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofAccelerationOffset + idx;
        }

        if( sensorType == DOF_TORQUE_SENSOR )
        {
            ret.offset = berdySensorTypeOffsets.dofTorquesOffset + idx;
        }
    }

    return ret;
}